

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

Rect __thiscall SkylineBinPack::InsertMinWaste(SkylineBinPack *this,int width,int height)

{
  bool bVar1;
  int local_34;
  int local_30;
  int bestIndex;
  int bestWastedArea;
  int bestHeight;
  int height_local;
  int width_local;
  SkylineBinPack *this_local;
  Rect newNode;
  
  bestWastedArea = height;
  bestHeight = width;
  _height_local = this;
  _this_local = FindPositionForNewNodeMinWaste(this,width,height,&bestIndex,&local_30,&local_34);
  if (local_34 == -1) {
    memset(&this_local,0,0x10);
  }
  else {
    bVar1 = DisjointRectCollection::Disjoint(&this->disjointRects,(Rect *)&this_local);
    if (!bVar1) {
      __assert_fail("disjointRects.Disjoint(newNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0x159,"Rect SkylineBinPack::InsertMinWaste(int, int)");
    }
    AddSkylineLevel(this,local_34,(Rect *)&this_local);
    this->usedSurfaceArea = (long)(bestHeight * bestWastedArea) + this->usedSurfaceArea;
    DisjointRectCollection::Add(&this->disjointRects,(Rect *)&this_local);
  }
  return _this_local;
}

Assistant:

Rect SkylineBinPack::InsertMinWaste(int width, int height)
{
	int bestHeight;
	int bestWastedArea;
	int bestIndex;
	Rect newNode = FindPositionForNewNodeMinWaste(width, height, bestHeight, bestWastedArea, bestIndex);

	if (bestIndex != -1)
	{
#ifdef _DEBUG
		assert(disjointRects.Disjoint(newNode));
#endif
		// Perform the actual packing.
		AddSkylineLevel(bestIndex, newNode);

		usedSurfaceArea += width * height;
#ifdef _DEBUG
		disjointRects.Add(newNode);
#endif
	}
	else
		memset(&newNode, 0, sizeof(newNode));

	return newNode;
}